

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O3

void HTS_Label_load_from_fn(HTS_Label *label,size_t sampling_rate,size_t fperiod,char *fn)

{
  HTS_Boolean HVar1;
  int iVar2;
  HTS_File *fp;
  ushort **ppuVar3;
  HTS_LabelString *pHVar4;
  char *pcVar5;
  HTS_LabelString *pHVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  int i;
  undefined1 local_45c [4];
  double local_458;
  double local_448;
  char local_438 [1032];
  
  fp = HTS_fopen_from_fn(fn,"r");
  if ((label->head == (HTS_LabelString *)0x0) && (label->size == 0)) {
    HVar1 = HTS_get_token_from_fp(fp,local_438);
    if (HVar1 != '\0') {
      auVar8._8_4_ = (int)(sampling_rate >> 0x20);
      auVar8._0_8_ = sampling_rate;
      auVar8._12_4_ = 0x45300000;
      auVar9._8_4_ = (int)(fperiod >> 0x20);
      auVar9._0_8_ = fperiod;
      auVar9._12_4_ = 0x45300000;
      dVar11 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sampling_rate) - 4503599627370496.0)) /
               (((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)fperiod) - 4503599627370496.0)) * 10000000.0);
      ppuVar3 = __ctype_b_loc();
      pHVar6 = (HTS_LabelString *)0x0;
      do {
        if (-1 < (short)(*ppuVar3)[local_438[0]]) break;
        label->size = label->size + 1;
        pHVar4 = (HTS_LabelString *)HTS_calloc(1,0x20);
        if (pHVar6 == (HTS_LabelString *)0x0) {
          pHVar6 = (HTS_LabelString *)label;
        }
        pHVar6->next = pHVar4;
        iVar2 = __isoc99_sscanf(local_438,"%d",local_45c);
        dVar7 = -1.0;
        dVar10 = -1.0;
        if (iVar2 == 1) {
          local_448 = atof(local_438);
          HTS_get_token_from_fp(fp,local_438);
          local_458 = atof(local_438);
          HTS_get_token_from_fp(fp,local_438);
          dVar7 = local_448 * dVar11;
          dVar10 = local_458 * dVar11;
        }
        pHVar4->start = dVar7;
        pHVar4->end = dVar10;
        pHVar4->next = (_HTS_LabelString *)0x0;
        pcVar5 = HTS_strdup(local_438);
        pHVar4->name = pcVar5;
        HVar1 = HTS_get_token_from_fp(fp,local_438);
        pHVar6 = pHVar4;
      } while (HVar1 != '\0');
    }
    HTS_Label_check_time((HTS_Label *)label->head);
  }
  else {
    HTS_error(1,"HTS_Label_load_from_fp: label is not initialized.\n");
  }
  HTS_fclose(fp);
  return;
}

Assistant:

void HTS_Label_load_from_fn(HTS_Label * label, size_t sampling_rate, size_t fperiod, const char *fn)
{
   HTS_File *fp = HTS_fopen_from_fn(fn, "r");
   HTS_Label_load(label, sampling_rate, fperiod, fp);
   HTS_fclose(fp);
}